

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O3

void duckdb_je_tcache_enabled_set(tsd_t *tsd,_Bool enabled)

{
  if (enabled && tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == false)
  {
    duckdb_je_tsd_tcache_data_init(tsd,(arena_t *)0x0,opt_tcache_ncached_max);
  }
  else if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true &&
           !enabled) {
    tcache_destroy(tsd,&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,true);
    switchD_00569a20::default
              ((tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins,0,0x6d8);
  }
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled = enabled;
  duckdb_je_tsd_slow_update(tsd);
  return;
}

Assistant:

void
tcache_enabled_set(tsd_t *tsd, bool enabled) {
	bool was_enabled = tsd_tcache_enabled_get(tsd);

	if (!was_enabled && enabled) {
		tsd_tcache_data_init(tsd, NULL,
		    tcache_get_default_ncached_max());
	} else if (was_enabled && !enabled) {
		tcache_cleanup(tsd);
	}
	/* Commit the state last.  Above calls check current state. */
	tsd_tcache_enabled_set(tsd, enabled);
	tsd_slow_update(tsd);
}